

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeReadIOCallback.cpp
# Opt level: O0

void __thiscall
libebml::SafeReadIOCallback::SafeReadIOCallback(SafeReadIOCallback *this,void *Mem,size_t Size)

{
  MemReadIOCallback *this_00;
  size_t Size_local;
  void *Mem_local;
  SafeReadIOCallback *this_local;
  
  this_00 = (MemReadIOCallback *)operator_new(0x20);
  MemReadIOCallback::MemReadIOCallback(this_00,Mem,Size);
  Init(this,(IOCallback *)this_00,true);
  return;
}

Assistant:

SafeReadIOCallback::SafeReadIOCallback(void const *Mem,
                                       size_t Size) {
  Init(new MemReadIOCallback(Mem, Size), true);
}